

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

char * nng_strerror(nng_err num)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  char *__s;
  
  uVar2 = (ulong)num;
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x210) {
      if ((num >> 0x1c & 1) == 0) {
        if ((num >> 0x1d & 1) == 0) {
          __s = nng_strerror::unknownerrbuf;
          pcVar4 = "Unknown error #%d";
        }
        else {
          uVar2 = (ulong)(num & ~(NNG_ETRANERR|NNG_ESYSERR));
          __s = nng_strerror::tranerrbuf;
          pcVar4 = "Transport error #%d";
        }
        snprintf(__s,0x20,pcVar4,uVar2);
        return __s;
      }
      pcVar4 = nni_plat_strerror(num & ~NNG_ESYSERR);
      return pcVar4;
    }
    lVar1 = lVar3 + 0x10;
  } while (*(nng_err *)((long)&nni_errors[0].code + lVar3) != num);
  return *(char **)((long)&nni_errors[0].msg + lVar3);
}

Assistant:

const char *
nng_strerror(nng_err num)
{
	static char unknownerrbuf[32];
	for (int i = 0; nni_errors[i].msg != NULL; i++) {
		if (nni_errors[i].code == num) {
			return (nni_errors[i].msg);
		}
	}

	if (num & NNG_ESYSERR) {
		return (nni_plat_strerror(num & ~NNG_ESYSERR));
	}

	if (num & NNG_ETRANERR) {
		static char tranerrbuf[32];
		(void) snprintf(tranerrbuf, sizeof(tranerrbuf),
		    "Transport error #%d", num & ~NNG_ETRANERR);
		return (tranerrbuf);
	}

	(void) snprintf(
	    unknownerrbuf, sizeof(unknownerrbuf), "Unknown error #%d", num);
	return (unknownerrbuf);
}